

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::CurrentNodeName_abi_cxx11_
          (string *__return_storage_ptr__,OgreXmlSerializer *this,bool forceRead)

{
  int iVar1;
  undefined4 extraout_var;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  OgreXmlSerializer *pOStack_18;
  bool forceRead_local;
  OgreXmlSerializer *this_local;
  
  local_19 = forceRead;
  pOStack_18 = this;
  this_local = (OgreXmlSerializer *)__return_storage_ptr__;
  if (forceRead) {
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)CONCAT44(extraout_var,iVar1),&local_41);
    std::__cxx11::string::operator=((string *)&this->m_currentNodeName,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_currentNodeName);
  return __return_storage_ptr__;
}

Assistant:

std::string OgreXmlSerializer::CurrentNodeName(bool forceRead)
{
    if (forceRead)
        m_currentNodeName = std::string(m_reader->getNodeName());
    return m_currentNodeName;
}